

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O2

IGUIFont * __thiscall
irr::gui::CGUIEnvironment::addFont(CGUIEnvironment *this,path *name,IGUIFont *font)

{
  uint uVar1;
  array<irr::gui::CGUIEnvironment::SFont> *this_00;
  SFont f;
  SFont local_68;
  
  if (font != (IGUIFont *)0x0) {
    local_68.NamedPath.Path.str._M_dataplus._M_p = (pointer)&local_68.NamedPath.Path.str.field_2;
    local_68.NamedPath.Path.str._M_string_length = 0;
    local_68.NamedPath.Path.str.field_2._M_local_buf[0] = '\0';
    local_68.NamedPath.InternalName.str._M_dataplus._M_p =
         (pointer)&local_68.NamedPath.InternalName.str.field_2;
    local_68.NamedPath.InternalName.str._M_string_length = 0;
    local_68.NamedPath.InternalName.str.field_2._M_local_buf[0] = '\0';
    irr::io::SNamedPath::setPath(&local_68.NamedPath,name);
    this_00 = &this->Fonts;
    uVar1 = core::array<irr::gui::CGUIEnvironment::SFont>::binary_search(this_00,&local_68);
    if (uVar1 == 0xffffffff) {
      local_68.Font = font;
      core::array<irr::gui::CGUIEnvironment::SFont>::push_back(this_00,&local_68);
      *(int *)(&font->field_0x10 + (long)font->_vptr_IGUIFont[-3]) =
           *(int *)(&font->field_0x10 + (long)font->_vptr_IGUIFont[-3]) + 1;
    }
    else {
      this_00 = (array<irr::gui::CGUIEnvironment::SFont> *)
                (this_00->m_data).
                super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar1].Font;
    }
    irr::io::SNamedPath::~SNamedPath(&local_68.NamedPath);
    if (uVar1 != 0xffffffff) {
      return (IGUIFont *)this_00;
    }
  }
  return font;
}

Assistant:

IGUIFont *CGUIEnvironment::addFont(const io::path &name, IGUIFont *font)
{
	if (font) {
		SFont f;
		f.NamedPath.setPath(name);
		s32 index = Fonts.binary_search(f);
		if (index != -1)
			return Fonts[index].Font;
		f.Font = font;
		Fonts.push_back(f);
		font->grab();
	}
	return font;
}